

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.hpp
# Opt level: O2

void kernel_to_references<float,unsigned_long>
               (TreesIndexer *indexer,IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,
               float *numeric_data,int *categ_data,float *Xc,unsigned_long *Xc_ind,
               unsigned_long *Xc_indptr,bool is_col_major,size_t ld_numeric,size_t ld_categ,
               size_t nrows,int nthreads,double *rmat,bool standardize)

{
  double *__s;
  pointer pSVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  unsigned_long *Xc_indptr_00;
  bool bVar5;
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> uVar6;
  size_t tree;
  long lVar7;
  size_t __n;
  __uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true> tree_num;
  long lVar8;
  long lVar9;
  ulong uVar10;
  float *pfVar11;
  float *Xc_00;
  float *Xr_indptr;
  size_t row;
  size_t sVar12;
  unsigned_long *Xc_ind_00;
  undefined1 auVar13 [16];
  unique_ptr<double[],_std::default_delete<double[]>_> ignored;
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> terminal_indices;
  SignalSwitcher ss;
  
  pSVar1 = (indexer->indices).super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar7 = ((long)(indexer->indices).
                 super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pSVar1) / 0x98;
  __n = (long)*(pointer *)
               ((long)&(pSVar1->reference_points).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8) -
        *(long *)&(pSVar1->reference_points).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl;
  SignalSwitcher::SignalSwitcher(&ss);
  tree_num.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)
       operator_new__(-(ulong)(lVar7 * nrows >> 0x3d != 0) | lVar7 * nrows * 8);
  uVar10 = 0xffffffffffffffff;
  if (nrows < 0x2000000000000000) {
    uVar10 = nrows * 8;
  }
  terminal_indices._M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
       (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
       tree_num.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
       super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
  ignored._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)operator_new__(uVar10);
  pfVar11 = (float *)0x0;
  Xc_00 = (float *)0x0;
  if (is_col_major) {
    Xc_00 = Xc;
  }
  Xc_ind_00 = (unsigned_long *)0x0;
  if (is_col_major) {
    Xc_ind_00 = Xc_ind;
  }
  Xr_indptr = (float *)Xc_indptr;
  Xc_indptr_00 = (unsigned_long *)0x0;
  if (is_col_major) {
    Xr_indptr = pfVar11;
    Xc = pfVar11;
    Xc_indptr_00 = Xc_indptr;
    Xc_ind = (unsigned_long *)pfVar11;
  }
  predict_iforest<float,unsigned_long>
            (numeric_data,categ_data,is_col_major,ld_numeric,ld_categ,Xc_00,Xc_ind_00,Xc_indptr_00,
             Xc,Xc_ind,(unsigned_long *)Xr_indptr,nrows,nthreads,false,model_outputs,
             model_outputs_ext,
             (double *)
             ignored._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl,
             (unsigned_long *)
             tree_num.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
             _M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl,(double *)0x0,indexer);
  std::__uniq_ptr_impl<double,_std::default_delete<double[]>_>::reset
            ((__uniq_ptr_impl<double,_std::default_delete<double[]>_> *)&ignored,(pointer)0x0);
  check_interrupt_switch(&ss);
  uVar6 = terminal_indices;
  bVar5 = interrupt_switch;
  lVar8 = (long)__n >> 3;
  pSVar1 = (indexer->indices).super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
           _M_impl.super__Vector_impl_data._M_start;
  for (sVar12 = 0; sVar12 != nrows; sVar12 = sVar12 + 1) {
    if ((bVar5 & 1U) == 0) {
      __s = rmat + sVar12 * lVar8;
      memset(__s,0,__n);
      for (lVar9 = 0; lVar9 != lVar7; lVar9 = lVar9 + 1) {
        lVar2 = *(long *)((long)uVar6._M_t.
                                super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl +
                          sVar12 * 8 + lVar9 * nrows * 8);
        lVar3 = *(long *)&pSVar1[lVar9].reference_indptr.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
        uVar4 = *(ulong *)(lVar3 + 8 + lVar2 * 8);
        for (uVar10 = *(ulong *)(lVar3 + lVar2 * 8); uVar10 < uVar4; uVar10 = uVar10 + 1) {
          lVar2 = *(long *)(*(long *)&pSVar1[lVar9].reference_mapping.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl + uVar10 * 8);
          __s[lVar2] = __s[lVar2] + 1.0;
        }
      }
    }
  }
  check_interrupt_switch(&ss);
  if (standardize) {
    auVar13._8_4_ = (int)((ulong)lVar7 >> 0x20);
    auVar13._0_8_ = lVar7;
    auVar13._12_4_ = 0x45300000;
    for (lVar9 = 0; lVar8 * nrows - lVar9 != 0; lVar9 = lVar9 + 1) {
      rmat[lVar9] = rmat[lVar9] /
                    ((auVar13._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0));
    }
  }
  check_interrupt_switch(&ss);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr(&ignored);
  std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
            (&terminal_indices);
  SignalSwitcher::~SignalSwitcher(&ss);
  return;
}

Assistant:

void kernel_to_references(TreesIndexer &indexer,
                          IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
                          real_t *restrict numeric_data, int *restrict categ_data,
                          real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                          bool is_col_major, size_t ld_numeric, size_t ld_categ,
                          size_t nrows, int nthreads,
                          double *restrict rmat,
                          bool standardize)
{
    size_t ntrees = indexer.indices.size();
    size_t n_ref = indexer.indices.front().reference_points.size();

    SignalSwitcher ss;

    std::unique_ptr<sparse_ix[]> terminal_indices(new sparse_ix[nrows*ntrees]);
    std::unique_ptr<double[]> ignored(new double[nrows]);
    predict_iforest(numeric_data, categ_data,
                    is_col_major, ld_numeric, ld_categ,
                    is_col_major? Xc : nullptr, is_col_major? Xc_ind : nullptr, is_col_major? Xc_indptr : nullptr,
                    is_col_major? (real_t*)nullptr : Xc, is_col_major? (sparse_ix*)nullptr : Xc_ind, is_col_major? (sparse_ix*)nullptr : Xc_indptr,
                    nrows, nthreads, false,
                    model_outputs, model_outputs_ext,
                    ignored.get(), terminal_indices.get(),
                    (double*)NULL,
                    &indexer);
    ignored.reset();

    check_interrupt_switch(ss);

    #pragma omp parallel for schedule(static) num_threads(nthreads) \
            shared(indexer, terminal_indices, nrows, ntrees, n_ref, rmat)
    for (size_t_for row = 0; row < (decltype(row))nrows; row++)
    {
        if (interrupt_switch) continue;

        SingleTreeIndex *restrict index_node;
        size_t idx_this;
        sparse_ix *restrict terminal_indices_this = terminal_indices.get() + row;
        double *restrict rmat_this = rmat + row*n_ref;
        memset(rmat_this, 0, n_ref*sizeof(double));

        for (size_t tree = 0; tree < ntrees; tree++)
        {
            idx_this = terminal_indices_this[tree*nrows];
            index_node = &indexer.indices[tree];
            for (size_t ind = index_node->reference_indptr[idx_this];
                 ind < index_node->reference_indptr[idx_this + 1];
                 ind++)
            {
                rmat_this[index_node->reference_mapping[ind]]++;
            }
        }
    }

    check_interrupt_switch(ss);

    if (standardize)
    {
        double ntrees_dbl = (double)ntrees;
        for (size_t ix = 0; ix < nrows*n_ref; ix++)
            rmat[ix] /= ntrees_dbl;
    }

    check_interrupt_switch(ss);
}